

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::CheckCompilerIdCompatibility(cmGlobalGenerator *this,cmMakefile *mf,string *lang)

{
  bool bVar1;
  PolicyStatus PVar2;
  string *psVar3;
  ostream *poVar4;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  PolicyID id_02;
  PolicyID id_03;
  PolicyID id_04;
  PolicyID id_05;
  PolicyID id_06;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string_view value_06;
  string_view value_07;
  string_view value_08;
  string emulated;
  string compilerId;
  string compilerIdVar;
  ostringstream w;
  string emulatedId;
  
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[13]>
            (&compilerIdVar,(char (*) [7])0x72f1a0,lang,(char (*) [13])0x734179);
  psVar3 = cmMakefile::GetSafeDefinition(mf,&compilerIdVar);
  std::__cxx11::string::string((string *)&compilerId,(string *)psVar3);
  bVar1 = std::operator==(&compilerId,"AppleClang");
  if (bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus(mf,CMP0025,false);
    if (PVar2 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)&w,(cmPolicies *)0x19,id);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)&w);
      std::__cxx11::string::~string((string *)&w);
    }
    else {
      if (PVar2 != OLD) {
        if (PVar2 != WARN) goto LAB_00256830;
        bVar1 = cmake::GetIsInTryCompile(this->CMakeInstance);
        if (!bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&w,"CMAKE_POLICY_WARNING_CMP0025",(allocator<char> *)&emulated);
          bVar1 = cmMakefile::PolicyOptionalWarningEnabled(mf,(string *)&w);
          std::__cxx11::string::~string((string *)&w);
          if (bVar1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&emulated,(cmPolicies *)0x19,id_00);
            poVar4 = std::operator<<((ostream *)&w,(string *)&emulated);
            poVar4 = std::operator<<(poVar4,"\nConverting ");
            poVar4 = std::operator<<(poVar4,(string *)lang);
            std::operator<<(poVar4," compiler id \"AppleClang\" to \"Clang\" for compatibility.");
            std::__cxx11::string::~string((string *)&emulated);
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&emulated);
            std::__cxx11::string::~string((string *)&emulated);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
          }
        }
      }
      value._M_str = "Clang";
      value._M_len = 5;
      cmMakefile::AddDefinition(mf,&compilerIdVar,value);
    }
  }
LAB_00256830:
  bVar1 = std::operator==(&compilerId,"QCC");
  if (bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus(mf,CMP0047,false);
    if (PVar2 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)&w,(cmPolicies *)0x2f,id_01);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)&w);
    }
    else {
      if (PVar2 != OLD) {
        if (PVar2 != WARN) goto LAB_002569cb;
        bVar1 = cmake::GetIsInTryCompile(this->CMakeInstance);
        if (!bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&w,"CMAKE_POLICY_WARNING_CMP0047",(allocator<char> *)&emulated);
          bVar1 = cmMakefile::PolicyOptionalWarningEnabled(mf,(string *)&w);
          std::__cxx11::string::~string((string *)&w);
          if (bVar1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&emulated,(cmPolicies *)0x2f,id_02);
            poVar4 = std::operator<<((ostream *)&w,(string *)&emulated);
            poVar4 = std::operator<<(poVar4,"\nConverting ");
            poVar4 = std::operator<<(poVar4,(string *)lang);
            std::operator<<(poVar4," compiler id \"QCC\" to \"GNU\" for compatibility.");
            std::__cxx11::string::~string((string *)&emulated);
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&emulated);
            std::__cxx11::string::~string((string *)&emulated);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
          }
        }
      }
      value_00._M_str = "GNU";
      value_00._M_len = 3;
      cmMakefile::AddDefinition(mf,&compilerIdVar,value_00);
      bVar1 = std::operator==(lang,"C");
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&w,"CMAKE_COMPILER_IS_GNUCC",(allocator<char> *)&emulated);
        value_01._M_str = "1";
        value_01._M_len = 1;
        cmMakefile::AddDefinition(mf,(string *)&w,value_01);
      }
      else {
        bVar1 = std::operator==(lang,"CXX");
        if (!bVar1) goto LAB_002569cb;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&w,"CMAKE_COMPILER_IS_GNUCXX",(allocator<char> *)&emulated);
        value_05._M_str = "1";
        value_05._M_len = 1;
        cmMakefile::AddDefinition(mf,(string *)&w,value_05);
      }
    }
    std::__cxx11::string::~string((string *)&w);
  }
LAB_002569cb:
  bVar1 = std::operator==(&compilerId,"XLClang");
  if (bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus(mf,CMP0089,false);
    if (PVar2 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)&w,(cmPolicies *)0x59,id_03);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)&w);
      std::__cxx11::string::~string((string *)&w);
    }
    else {
      if (PVar2 != OLD) {
        if (PVar2 != WARN) goto LAB_00256b22;
        bVar1 = cmake::GetIsInTryCompile(this->CMakeInstance);
        if (!bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&w,"CMAKE_POLICY_WARNING_CMP0089",(allocator<char> *)&emulated);
          bVar1 = cmMakefile::PolicyOptionalWarningEnabled(mf,(string *)&w);
          std::__cxx11::string::~string((string *)&w);
          if (bVar1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&emulated,(cmPolicies *)0x59,id_04);
            poVar4 = std::operator<<((ostream *)&w,(string *)&emulated);
            poVar4 = std::operator<<(poVar4,"\nConverting ");
            poVar4 = std::operator<<(poVar4,(string *)lang);
            std::operator<<(poVar4," compiler id \"XLClang\" to \"XL\" for compatibility.");
            std::__cxx11::string::~string((string *)&emulated);
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&emulated);
            std::__cxx11::string::~string((string *)&emulated);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
          }
        }
      }
      value_02._M_str = "XL";
      value_02._M_len = 2;
      cmMakefile::AddDefinition(mf,&compilerIdVar,value_02);
    }
  }
LAB_00256b22:
  bVar1 = std::operator==(&compilerId,"LCC");
  if (!bVar1) goto LAB_00256e49;
  PVar2 = cmMakefile::GetPolicyStatus(mf,CMP0129,false);
  if (PVar2 - REQUIRED_IF_USED < 2) {
    cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)&w,(cmPolicies *)0x81,id_05);
    cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)&w);
  }
  else {
    if (PVar2 != OLD) {
      if (PVar2 != WARN) goto LAB_00256e49;
      bVar1 = cmake::GetIsInTryCompile(this->CMakeInstance);
      if (!bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&w,"CMAKE_POLICY_WARNING_CMP0129",(allocator<char> *)&emulated);
        bVar1 = cmMakefile::PolicyOptionalWarningEnabled(mf,(string *)&w);
        std::__cxx11::string::~string((string *)&w);
        if (bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&emulated,(cmPolicies *)0x81,id_06);
          poVar4 = std::operator<<((ostream *)&w,(string *)&emulated);
          poVar4 = std::operator<<(poVar4,"\nConverting ");
          poVar4 = std::operator<<(poVar4,(string *)lang);
          std::operator<<(poVar4," compiler id \"LCC\" to \"GNU\" for compatibility.");
          std::__cxx11::string::~string((string *)&emulated);
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&emulated);
          std::__cxx11::string::~string((string *)&emulated);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
        }
      }
    }
    value_03._M_str = "GNU";
    value_03._M_len = 3;
    cmMakefile::AddDefinition(mf,&compilerIdVar,value_03);
    bVar1 = std::operator==(lang,"C");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&w,"CMAKE_COMPILER_IS_GNUCC",(allocator<char> *)&emulated);
      value_04._M_str = "1";
      value_04._M_len = 1;
      cmMakefile::AddDefinition(mf,(string *)&w,value_04);
LAB_00256d8c:
      std::__cxx11::string::~string((string *)&w);
    }
    else {
      bVar1 = std::operator==(lang,"CXX");
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&w,"CMAKE_COMPILER_IS_GNUCXX",(allocator<char> *)&emulated);
        value_06._M_str = "1";
        value_06._M_len = 1;
        cmMakefile::AddDefinition(mf,(string *)&w,value_06);
        goto LAB_00256d8c;
      }
      bVar1 = std::operator==(lang,"Fortran");
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&w,"CMAKE_COMPILER_IS_GNUG77",(allocator<char> *)&emulated);
        value_07._M_str = "1";
        value_07._M_len = 1;
        cmMakefile::AddDefinition(mf,(string *)&w,value_07);
        goto LAB_00256d8c;
      }
    }
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[18]>
              ((string *)&w,(char (*) [7])0x72f1a0,lang,(char (*) [18])0x734190);
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[18]>
              (&emulated,(char (*) [7])0x72f1a0,lang,(char (*) [18])"_SIMULATE_VERSION");
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[13]>
              (&emulatedId,(char (*) [7])0x72f1a0,lang,(char (*) [13])0x72559d);
    psVar3 = cmMakefile::GetRequiredDefinition(mf,&emulated);
    value_08._M_str = (psVar3->_M_dataplus)._M_p;
    value_08._M_len = psVar3->_M_string_length;
    cmMakefile::AddDefinition(mf,(string *)&w,value_08);
    cmMakefile::RemoveDefinition(mf,&emulatedId);
    cmMakefile::RemoveDefinition(mf,&emulated);
    std::__cxx11::string::~string((string *)&emulatedId);
    std::__cxx11::string::~string((string *)&emulated);
  }
  std::__cxx11::string::~string((string *)&w);
LAB_00256e49:
  std::__cxx11::string::~string((string *)&compilerId);
  std::__cxx11::string::~string((string *)&compilerIdVar);
  return;
}

Assistant:

void cmGlobalGenerator::CheckCompilerIdCompatibility(
  cmMakefile* mf, std::string const& lang) const
{
  std::string compilerIdVar = cmStrCat("CMAKE_", lang, "_COMPILER_ID");
  std::string const compilerId = mf->GetSafeDefinition(compilerIdVar);

  if (compilerId == "AppleClang") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0025)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0025")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0025) << "\n"
            "Converting " << lang <<
            R"( compiler id "AppleClang" to "Clang" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert AppleClang to Clang.
        mf->AddDefinition(compilerIdVar, "Clang");
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0025));
        break;
      case cmPolicies::NEW:
        // NEW behavior is to keep AppleClang.
        break;
    }
  }

  if (compilerId == "QCC") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0047)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0047")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0047) << "\n"
            "Converting " << lang <<
            R"( compiler id "QCC" to "GNU" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert QCC to GNU.
        mf->AddDefinition(compilerIdVar, "GNU");
        if (lang == "C") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCC", "1");
        } else if (lang == "CXX") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCXX", "1");
        }
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0047));
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to keep QCC.
        break;
    }
  }

  if (compilerId == "XLClang") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0089)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0089")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0089) << "\n"
            "Converting " << lang <<
            R"( compiler id "XLClang" to "XL" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert XLClang to XL.
        mf->AddDefinition(compilerIdVar, "XL");
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0089));
        break;
      case cmPolicies::NEW:
        // NEW behavior is to keep AppleClang.
        break;
    }
  }

  if (compilerId == "LCC") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0129)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0129")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0129) << "\n"
            "Converting " << lang <<
            R"( compiler id "LCC" to "GNU" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert LCC to GNU.
        mf->AddDefinition(compilerIdVar, "GNU");
        if (lang == "C") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCC", "1");
        } else if (lang == "CXX") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCXX", "1");
        } else if (lang == "Fortran") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUG77", "1");
        }
        {
          // Fix compiler versions.
          std::string version = cmStrCat("CMAKE_", lang, "_COMPILER_VERSION");
          std::string emulated = cmStrCat("CMAKE_", lang, "_SIMULATE_VERSION");
          std::string emulatedId = cmStrCat("CMAKE_", lang, "_SIMULATE_ID");
          std::string const& actual = mf->GetRequiredDefinition(emulated);
          mf->AddDefinition(version, actual);
          mf->RemoveDefinition(emulatedId);
          mf->RemoveDefinition(emulated);
        }
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0129));
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to keep LCC.
        break;
    }
  }
}